

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_address.cpp
# Opt level: O1

int CfdParseDescriptor(void *handle,char *descriptor,int network_type,char *bip32_derivation_path,
                      void **descriptor_handle,uint32_t *max_index)

{
  DescriptorScriptType *pDVar1;
  NetType type;
  size_t sVar2;
  void *pvVar3;
  undefined8 *puVar4;
  vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *this;
  CfdException *pCVar5;
  bool is_bitcoin;
  vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> script_list;
  vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> multisig_key_list;
  string derive_path;
  AddressFactory factory;
  DescriptorScriptData desc_data;
  bool local_749;
  vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> local_748;
  vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> local_728;
  string local_708;
  string local_6e8;
  AddressFactory local_6c8;
  undefined1 local_6a0 [552];
  DescriptorScriptType local_478;
  TapBranch local_470;
  TaprootScriptTree local_3f8;
  undefined1 local_368 [552];
  DescriptorScriptType local_140;
  TapBranch TStack_138;
  TaprootScriptTree TStack_c0;
  
  cfd::Initialize();
  if (descriptor_handle == (void **)0x0) {
    local_6a0._0_8_ = "cfdcapi_address.cpp";
    local_6a0._8_4_ = 0x1a0;
    local_6a0._16_8_ = "CfdParseDescriptor";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_6a0,kCfdLogLevelWarning,"descriptor handle is null.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_6a0._0_8_ = local_6a0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_6a0,"Failed to parameter. descriptor handle is null.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_6a0);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (descriptor == (char *)0x0) {
    local_6a0._0_8_ = "cfdcapi_address.cpp";
    local_6a0._8_4_ = 0x1a6;
    local_6a0._16_8_ = "CfdParseDescriptor";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_6a0,kCfdLogLevelWarning,"descriptor is null.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_6a0._0_8_ = local_6a0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_6a0,"Failed to parameter. descriptor is null.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_6a0);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_749 = false;
  type = cfd::capi::ConvertNetType(network_type,&local_749);
  local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
  local_6e8._M_string_length = 0;
  local_6e8.field_2._M_local_buf[0] = '\0';
  if ((bip32_derivation_path != (char *)0x0) && (*bip32_derivation_path != '\0')) {
    local_6a0._0_8_ = local_6a0 + 0x10;
    sVar2 = strlen(bip32_derivation_path);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_6a0,bip32_derivation_path,bip32_derivation_path + sVar2);
    std::__cxx11::string::operator=((string *)&local_6e8,(string *)local_6a0);
    if ((undefined1 *)local_6a0._0_8_ != local_6a0 + 0x10) {
      operator_delete((void *)local_6a0._0_8_);
    }
  }
  local_748.
  super__Vector_base<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_748.
  super__Vector_base<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_748.
  super__Vector_base<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_728.super__Vector_base<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_728.super__Vector_base<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_728.super__Vector_base<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cfd::DescriptorScriptData::DescriptorScriptData((DescriptorScriptData *)local_6a0);
  if (local_749 == true) {
    cfd::AddressFactory::AddressFactory(&local_6c8,type);
    local_708._M_dataplus._M_p = (pointer)&local_708.field_2;
    sVar2 = strlen(descriptor);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_708,descriptor,descriptor + sVar2);
    cfd::AddressFactory::ParseOutputDescriptor
              ((DescriptorScriptData *)local_368,&local_6c8,&local_708,&local_6e8,&local_748,
               &local_728,(vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)0x0);
    local_6a0._0_4_ = local_368._0_4_;
    cfd::core::Script::operator=((Script *)(local_6a0 + 8),(Script *)(local_368 + 8));
    local_6a0._64_4_ = local_368._64_4_;
    cfd::core::Address::operator=((Address *)(local_6a0 + 0x48),(Address *)(local_368 + 0x48));
    local_6a0._448_4_ = local_368._448_4_;
    cfd::core::Script::operator=((Script *)(local_6a0 + 0x1c8),(Script *)(local_368 + 0x1c8));
    local_6a0._512_4_ = local_368._512_4_;
    std::__cxx11::string::operator=((string *)(local_6a0 + 0x208),(string *)(local_368 + 0x208));
    local_478 = local_140;
    cfd::core::TapBranch::operator=(&local_470,&TStack_138);
    cfd::core::TaprootScriptTree::operator=(&local_3f8,&TStack_c0);
  }
  else {
    cfd::ElementsAddressFactory::ElementsAddressFactory((ElementsAddressFactory *)&local_6c8,type);
    local_708._M_dataplus._M_p = (pointer)&local_708.field_2;
    sVar2 = strlen(descriptor);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_708,descriptor,descriptor + sVar2);
    cfd::AddressFactory::ParseOutputDescriptor
              ((DescriptorScriptData *)local_368,&local_6c8,&local_708,&local_6e8,&local_748,
               &local_728,(vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)0x0);
    local_6a0._0_4_ = local_368._0_4_;
    cfd::core::Script::operator=((Script *)(local_6a0 + 8),(Script *)(local_368 + 8));
    local_6a0._64_4_ = local_368._64_4_;
    cfd::core::Address::operator=((Address *)(local_6a0 + 0x48),(Address *)(local_368 + 0x48));
    local_6a0._448_4_ = local_368._448_4_;
    cfd::core::Script::operator=((Script *)(local_6a0 + 0x1c8),(Script *)(local_368 + 0x1c8));
    local_6a0._512_4_ = local_368._512_4_;
    std::__cxx11::string::operator=((string *)(local_6a0 + 0x208),(string *)(local_368 + 0x208));
    local_478 = local_140;
    cfd::core::TapBranch::operator=(&local_470,&TStack_138);
    cfd::core::TaprootScriptTree::operator=(&local_3f8,&TStack_c0);
  }
  cfd::DescriptorScriptData::~DescriptorScriptData((DescriptorScriptData *)local_368);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_708._M_dataplus._M_p != &local_708.field_2) {
    operator_delete(local_708._M_dataplus._M_p);
  }
  local_6c8._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_00733578;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_6c8.prefix_list_);
  if (local_748.
      super__Vector_base<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_748.
      super__Vector_base<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::push_back
              (&local_748,(value_type *)local_6a0);
  }
  local_368._0_8_ = local_368 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"Descriptor","");
  pvVar3 = cfd::capi::AllocBuffer((string *)local_368,0x28);
  if ((undefined1 *)local_368._0_8_ != local_368 + 0x10) {
    operator_delete((void *)local_368._0_8_);
  }
  puVar4 = (undefined8 *)operator_new(0x18);
  *puVar4 = 0;
  puVar4[1] = 0;
  puVar4[2] = 0;
  *(undefined8 **)((long)pvVar3 + 0x18) = puVar4;
  puVar4 = (undefined8 *)operator_new(0x18);
  *puVar4 = 0;
  puVar4[1] = 0;
  puVar4[2] = 0;
  *(undefined8 **)((long)pvVar3 + 0x20) = puVar4;
  this = (vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)
         operator_new(0x18);
  std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::vector
            (this,1,(allocator_type *)local_368);
  *(vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> **)
   ((long)pvVar3 + 0x10) = this;
  std::vector<cfd::DescriptorScriptData,std::allocator<cfd::DescriptorScriptData>>::
  _M_assign_aux<__gnu_cxx::__normal_iterator<cfd::DescriptorScriptData*,std::vector<cfd::DescriptorScriptData,std::allocator<cfd::DescriptorScriptData>>>>
            (*(vector<cfd::DescriptorScriptData,std::allocator<cfd::DescriptorScriptData>> **)
              ((long)pvVar3 + 0x18),
             local_748.
             super__Vector_base<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>
             ._M_impl.super__Vector_impl_data._M_start,
             local_748.
             super__Vector_base<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  std::vector<cfd::DescriptorKeyData,std::allocator<cfd::DescriptorKeyData>>::
  _M_assign_aux<__gnu_cxx::__normal_iterator<cfd::DescriptorKeyData*,std::vector<cfd::DescriptorKeyData,std::allocator<cfd::DescriptorKeyData>>>>
            (*(vector<cfd::DescriptorKeyData,std::allocator<cfd::DescriptorKeyData>> **)
              ((long)pvVar3 + 0x20),
             local_728.
             super__Vector_base<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>.
             _M_impl.super__Vector_impl_data._M_start,
             local_728.
             super__Vector_base<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  pDVar1 = (DescriptorScriptType *)**(long **)((long)pvVar3 + 0x10);
  *pDVar1 = local_6a0._0_4_;
  cfd::core::Script::operator=((Script *)(pDVar1 + 2),(Script *)(local_6a0 + 8));
  pDVar1[0x10] = local_6a0._64_4_;
  cfd::core::Address::operator=((Address *)(pDVar1 + 0x12),(Address *)(local_6a0 + 0x48));
  pDVar1[0x70] = local_6a0._448_4_;
  cfd::core::Script::operator=((Script *)(pDVar1 + 0x72),(Script *)(local_6a0 + 0x1c8));
  pDVar1[0x80] = local_6a0._512_4_;
  std::__cxx11::string::_M_assign((string *)(pDVar1 + 0x82));
  pDVar1[0x8a] = local_478;
  cfd::core::TapBranch::operator=((TapBranch *)(pDVar1 + 0x8c),&local_470);
  cfd::core::TaprootScriptTree::operator=((TaprootScriptTree *)(pDVar1 + 0xaa),&local_3f8);
  if (max_index != (uint32_t *)0x0) {
    *max_index = (int)((ulong)((long)local_748.
                                     super__Vector_base<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_748.
                                    super__Vector_base<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x2cbce4a9 -
                 1;
  }
  *descriptor_handle = pvVar3;
  cfd::DescriptorScriptData::~DescriptorScriptData((DescriptorScriptData *)local_6a0);
  std::vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>::~vector(&local_728);
  std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::~vector
            (&local_748);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e8._M_dataplus._M_p != &local_6e8.field_2) {
    operator_delete(local_6e8._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

int CfdParseDescriptor(
    void* handle, const char* descriptor, int network_type,
    const char* bip32_derivation_path, void** descriptor_handle,
    uint32_t* max_index) {
  CfdCapiOutputDescriptor* buffer = nullptr;
  try {
    cfd::Initialize();
    if (descriptor_handle == nullptr) {
      warn(CFD_LOG_SOURCE, "descriptor handle is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. descriptor handle is null.");
    }
    if (descriptor == nullptr) {
      warn(CFD_LOG_SOURCE, "descriptor is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. descriptor is null.");
    }

    bool is_bitcoin = false;
    NetType net_type = cfd::capi::ConvertNetType(network_type, &is_bitcoin);
    std::string derive_path;
    if ((bip32_derivation_path != nullptr) &&
        (*bip32_derivation_path != '\0')) {
      derive_path = std::string(bip32_derivation_path);
    }

    std::vector<DescriptorScriptData> script_list;
    std::vector<DescriptorKeyData> multisig_key_list;
    DescriptorScriptData desc_data;
    if (is_bitcoin) {
      AddressFactory factory(net_type);
      desc_data = factory.ParseOutputDescriptor(
          descriptor, derive_path, &script_list, &multisig_key_list);
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ElementsAddressFactory factory(net_type);
      desc_data = factory.ParseOutputDescriptor(
          descriptor, derive_path, &script_list, &multisig_key_list);
#else
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Elements not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }
    if (script_list.empty()) {
      script_list.push_back(desc_data);
    }

    buffer = static_cast<CfdCapiOutputDescriptor*>(
        AllocBuffer(kPrefixOutputDescriptor, sizeof(CfdCapiOutputDescriptor)));
    buffer->script_list = new std::vector<DescriptorScriptData>();
    buffer->multisig_key_list = new std::vector<DescriptorKeyData>();
    buffer->script_root = new std::vector<DescriptorScriptData>(1);
    buffer->script_list->assign(script_list.begin(), script_list.end());
    // *(buffer->script_list) = script_list;
    buffer->multisig_key_list->assign(
        multisig_key_list.begin(), multisig_key_list.end());
    // *(buffer->multisig_key_list) = multisig_key_list;
    (*buffer->script_root)[0] = desc_data;
    if (max_index != nullptr) {
      *max_index = static_cast<uint32_t>(script_list.size() - 1);
    }
    *descriptor_handle = buffer;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    if (buffer != nullptr) CfdFreeDescriptorHandle(handle, buffer);
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    if (buffer != nullptr) CfdFreeDescriptorHandle(handle, buffer);
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    if (buffer != nullptr) CfdFreeDescriptorHandle(handle, buffer);
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}